

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O2

BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
 __thiscall
mp::BasicExprFactory<std::allocator<char>>::
MakeBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
          (BasicExprFactory<std::allocator<char>> *this,Kind kind,
          BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> lhs,
          BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> rhs)

{
  BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
  BVar1;
  
  BVar1.super_BasicExpr<(mp::expr::Kind)53,_(mp::expr::Kind)58>.super_ExprBase.impl_ =
       (BasicExpr<(mp::expr::Kind)53,_(mp::expr::Kind)58>)
       Allocate<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
                 (this,kind,0);
  ((ExprBase *)
  ((long)BVar1.super_BasicExpr<(mp::expr::Kind)53,_(mp::expr::Kind)58>.super_ExprBase.impl_ + 8))->
  impl_ = (Impl *)lhs.super_ExprBase.impl_;
  ((ExprBase *)
  ((long)BVar1.super_BasicExpr<(mp::expr::Kind)53,_(mp::expr::Kind)58>.super_ExprBase.impl_ + 0x10))
  ->impl_ = (Impl *)rhs.super_ExprBase.impl_;
  return (BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
          )BVar1.super_BasicExpr<(mp::expr::Kind)53,_(mp::expr::Kind)58>.super_ExprBase.impl_;
}

Assistant:

ExprType MakeBinary(expr::Kind kind, LHS lhs, RHS rhs) {
    MP_ASSERT(internal::Is<ExprType>(kind), "invalid expression kind");
    MP_ASSERT(lhs != 0 && rhs != 0, "invalid argument");
    typename ExprType::Impl *impl = Allocate<ExprType>(kind);
    impl->lhs = lhs.impl_;
    impl->rhs = rhs.impl_;
    return Expr::Create<ExprType>(impl);
  }